

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t countspaces(char *bytes,size_t howmany)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (howmany != 0) {
    sVar2 = 0;
    do {
      if (((ulong)(byte)bytes[sVar2] < 0x21) &&
         ((0x100002400U >> ((ulong)(byte)bytes[sVar2] & 0x3f) & 1) != 0)) {
        sVar1 = sVar1 + 1;
      }
      sVar2 = sVar2 + 1;
    } while (howmany != sVar2);
  }
  return sVar1;
}

Assistant:

size_t countspaces(const char *bytes, size_t howmany) {
  size_t count = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      count++;
    }
  }
  return count;
}